

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_0::PointsTestGroup::init
          (PointsTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  PointCase *pPVar1;
  Vec4 local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Vec4 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_238.m_data[2] = 0.0;
  local_238.m_data[3] = 1.0;
  local_228 = 0x3dcccccd3dcccccd;
  uStack_220 = 0x3f8000003dcccccd;
  local_218 = 0x3dcccccdbdcccccd;
  uStack_210 = 0x3f800000bdcccccd;
  local_208 = 0xbdcccccdbdcccccd;
  uStack_200 = 0x3f8000003dcccccd;
  local_1f8 = 0xbdcccccd3dcccccd;
  uStack_1f0 = 0x3f800000bdcccccd;
  local_1e8 = 0x4000000040000000;
  uStack_1e0 = 0x4040000040000000;
  local_1d8 = 0xc0000000c0000000;
  uStack_1d0 = 0x4040000040000000;
  local_1c8 = 0xbf0000003f000000;
  uStack_1c0 = 0x3f3333333f000000;
  local_1b8 = 0x3f000000bf000000;
  uStack_1b0 = 0x3f333333bf000000;
  local_1a8 = 0xc0000000c0000000;
  uStack_1a0 = 0x400ccccd00000000;
  local_198 = 0xbf8000003f800000;
  uStack_190 = 0x3f8ccccd00000000;
  local_188 = 0x3f800000bf800000;
  uStack_180 = 0x3f8ccccd00000000;
  local_178 = 0x3fa66666;
  uStack_170 = 0x3f80000000000000;
  local_168 = 0xbfa66666;
  uStack_160 = 0x3f80000000000000;
  local_158 = 0x3fa6666600000000;
  uStack_150 = 0x3f80000000000000;
  local_148 = 0xbfa6666600000000;
  uStack_140 = 0x3f80000000000000;
  local_138 = 0xbfa66666bfa66666;
  uStack_130 = 0x3f80000000000000;
  local_128 = 0x3fa66666bfa66666;
  uStack_120 = 0x3f80000000000000;
  local_118 = 0x3fa666663fa66666;
  uStack_110 = 0x3f80000000000000;
  local_108 = 0xbfa666663fa66666;
  uStack_100 = 0x3f80000000000000;
  local_f8 = 0x3f8147ae3f8147ae;
  uStack_f0 = 0x3f80000000000000;
  local_e8 = 0x3f8147ae00000000;
  uStack_e0 = 0x3f80000000000000;
  local_d8 = 0x3f8147ae;
  uStack_d0 = 0x3f80000000000000;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_c8.m_data[2] = 0.0;
  local_c8.m_data[3] = 1.0;
  local_b8 = 0x3dcccccd3dcccccd;
  uStack_b0 = 0x3f8000003dcccccd;
  local_a8 = 0x3dcccccdbdcccccd;
  uStack_a0 = 0x3f800000bdcccccd;
  local_98 = 0xbdcccccdbdcccccd;
  uStack_90 = 0x3f8000003dcccccd;
  local_88 = 0xbdcccccd3dcccccd;
  uStack_80 = 0x3f800000bdcccccd;
  local_78 = 0x3dcccccd;
  uStack_70 = 0x3f8000003f8ccccd;
  local_68 = 0xbdcccccd;
  uStack_60 = 0x3f800000bf8ccccd;
  local_58 = 0xbdcccccd80000000;
  uStack_50 = 0x3f8000003f8ccccd;
  local_48 = 0x3dcccccd00000000;
  uStack_40 = 0x3f800000bf8ccccd;
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"point_z_clip","point z clipping",
             &local_c8,(Vec4 *)&stack0xffffffffffffffc8,1.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"point_z_clip_viewport_center",
             "point z clipping",&local_c8,(Vec4 *)&stack0xffffffffffffffc8,1.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"point_z_clip_viewport_corner",
             "point z clipping",&local_c8,(Vec4 *)&stack0xffffffffffffffc8,1.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"point_clip_viewport_center",
             "point viewport clipping",&local_238,&local_c8,1.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"point_clip_viewport_corner",
             "point viewport clipping",&local_238,&local_c8,1.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_z_clip","point z clipping",
             &local_c8,(Vec4 *)&stack0xffffffffffffffc8,5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_z_clip_viewport_center",
             "point z clipping",&local_c8,(Vec4 *)&stack0xffffffffffffffc8,5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_z_clip_viewport_corner",
             "point z clipping",&local_c8,(Vec4 *)&stack0xffffffffffffffc8,5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_clip",
             "point viewport clipping",&local_238,&local_c8,5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_clip_viewport_center",
             "point viewport clipping",&local_238,&local_c8,5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_clip_viewport_corner",
             "point viewport clipping",&local_238,&local_c8,5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  return extraout_EAX;
}

Assistant:

void PointsTestGroup::init (void)
{
	const float littleOverViewport = 1.0f + (2.0f / (TEST_CANVAS_SIZE)); // one pixel over the viewport edge in VIEWPORT_WHOLE, half pixels over in the reduced viewport.

	const tcu::Vec4 viewportTestPoints[] =
	{
		// in clip volume
		tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),
		tcu::Vec4( 0.1f,  0.1f,  0.1f,  1.0f),
		tcu::Vec4(-0.1f,  0.1f, -0.1f,  1.0f),
		tcu::Vec4(-0.1f, -0.1f,  0.1f,  1.0f),
		tcu::Vec4( 0.1f, -0.1f, -0.1f,  1.0f),

		// in clip volume with w != 1
		tcu::Vec4( 2.0f,  2.0f,  2.0f,  3.0f),
		tcu::Vec4(-2.0f, -2.0f,  2.0f,  3.0f),
		tcu::Vec4( 0.5f, -0.5f,  0.5f,  0.7f),
		tcu::Vec4(-0.5f,  0.5f, -0.5f,  0.7f),

		// near the edge
		tcu::Vec4(-2.0f, -2.0f,  0.0f,  2.2f),
		tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.1f),
		tcu::Vec4(-1.0f,  1.0f,  0.0f,  1.1f),

		// not in the volume but still between near and far planes
		tcu::Vec4( 1.3f,  0.0f,  0.0f,  1.0f),
		tcu::Vec4(-1.3f,  0.0f,  0.0f,  1.0f),
		tcu::Vec4( 0.0f,  1.3f,  0.0f,  1.0f),
		tcu::Vec4( 0.0f, -1.3f,  0.0f,  1.0f),

		tcu::Vec4(-1.3f, -1.3f,  0.0f,  1.0f),
		tcu::Vec4(-1.3f,  1.3f,  0.0f,  1.0f),
		tcu::Vec4( 1.3f,  1.3f,  0.0f,  1.0f),
		tcu::Vec4( 1.3f, -1.3f,  0.0f,  1.0f),

		// outside the viewport, wide points have fragments in the viewport
		tcu::Vec4( littleOverViewport,  littleOverViewport,  0.0f,  1.0f),
		tcu::Vec4(               0.0f,  littleOverViewport,  0.0f,  1.0f),
		tcu::Vec4( littleOverViewport,                0.0f,  0.0f,  1.0f),
	};
	const tcu::Vec4 depthTestPoints[] =
	{
		// in clip volume
		tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),
		tcu::Vec4( 0.1f,  0.1f,  0.1f,  1.0f),
		tcu::Vec4(-0.1f,  0.1f, -0.1f,  1.0f),
		tcu::Vec4(-0.1f, -0.1f,  0.1f,  1.0f),
		tcu::Vec4( 0.1f, -0.1f, -0.1f,  1.0f),

		// not between the near and the far planes. These should be clipped
		tcu::Vec4( 0.1f,  0.0f,  1.1f,  1.0f),
		tcu::Vec4(-0.1f,  0.0f, -1.1f,  1.0f),
		tcu::Vec4(-0.0f, -0.1f,  1.1f,  1.0f),
		tcu::Vec4( 0.0f,  0.1f, -1.1f,  1.0f)
	};

	addChild(new PointCase(m_context, "point_z_clip",						"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		1.0f,	VIEWPORT_WHOLE));
	addChild(new PointCase(m_context, "point_z_clip_viewport_center",		"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		1.0f,	VIEWPORT_CENTER));
	addChild(new PointCase(m_context, "point_z_clip_viewport_corner",		"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		1.0f,	VIEWPORT_CORNER));

	addChild(new PointCase(m_context, "point_clip_viewport_center",			"point viewport clipping",		DE_ARRAY_BEGIN(viewportTestPoints), DE_ARRAY_END(viewportTestPoints),	1.0f,	VIEWPORT_CENTER));
	addChild(new PointCase(m_context, "point_clip_viewport_corner",			"point viewport clipping",		DE_ARRAY_BEGIN(viewportTestPoints), DE_ARRAY_END(viewportTestPoints),	1.0f,	VIEWPORT_CORNER));

	addChild(new PointCase(m_context, "wide_point_z_clip",					"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		5.0f,	VIEWPORT_WHOLE));
	addChild(new PointCase(m_context, "wide_point_z_clip_viewport_center",	"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		5.0f,	VIEWPORT_CENTER));
	addChild(new PointCase(m_context, "wide_point_z_clip_viewport_corner",	"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		5.0f,	VIEWPORT_CORNER));

	addChild(new PointCase(m_context, "wide_point_clip",					"point viewport clipping",		DE_ARRAY_BEGIN(viewportTestPoints), DE_ARRAY_END(viewportTestPoints),	5.0f,	VIEWPORT_WHOLE));
	addChild(new PointCase(m_context, "wide_point_clip_viewport_center",	"point viewport clipping",		DE_ARRAY_BEGIN(viewportTestPoints), DE_ARRAY_END(viewportTestPoints),	5.0f,	VIEWPORT_CENTER));
	addChild(new PointCase(m_context, "wide_point_clip_viewport_corner",	"point viewport clipping",		DE_ARRAY_BEGIN(viewportTestPoints), DE_ARRAY_END(viewportTestPoints),	5.0f,	VIEWPORT_CORNER));
}